

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

TriggerPrg * getRowTrigger(Parse *pParse,Trigger *pTrigger,Table *pTab,int orconf)

{
  TriggerPrg **ppTVar1;
  u8 uVar2;
  sqlite3 *db;
  TriggerStep *pStep;
  Op *pOVar3;
  int iVar4;
  Parse *pPVar5;
  TriggerPrg *pTVar6;
  SubProgram *pSVar7;
  Vdbe *pVVar8;
  char *pcVar9;
  Expr *pEVar10;
  SrcList *pSVar11;
  ExprList *pEVar12;
  IdList *pColumn;
  Upsert *pUpsert;
  Select *pSVar13;
  Expr *in_R8;
  TriggerStep **ppTVar14;
  TriggerPrg **ppTVar15;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  Vdbe *p;
  int local_260;
  undefined1 local_228 [24];
  char *local_210;
  undefined1 local_200 [24];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  Parse local_1c8;
  
  pPVar5 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar5 = pParse;
  }
  ppTVar1 = &pPVar5->pTriggerPrg;
  ppTVar15 = ppTVar1;
  while (pTVar6 = *ppTVar15, pTVar6 != (TriggerPrg *)0x0) {
    if ((pTVar6->pTrigger == pTrigger) && (pTVar6->orconf == orconf)) {
      return pTVar6;
    }
    ppTVar15 = &pTVar6->pNext;
  }
  db = pParse->db;
  pTVar6 = (TriggerPrg *)sqlite3DbMallocZero(db,0x28);
  if (pTVar6 != (TriggerPrg *)0x0) {
    pTVar6->pNext = *ppTVar1;
    *ppTVar1 = pTVar6;
    pSVar7 = (SubProgram *)sqlite3DbMallocZero(db,0x30);
    pTVar6->pProgram = pSVar7;
    if (pSVar7 != (SubProgram *)0x0) {
      pVVar8 = pPVar5->pVdbe;
      pSVar7->pNext = pVVar8->pProgram;
      pVVar8->pProgram = pSVar7;
      pTVar6->pTrigger = pTrigger;
      pTVar6->orconf = orconf;
      pTVar6->aColmask[0] = 0xffffffff;
      pTVar6->aColmask[1] = 0xffffffff;
      sqlite3ParseObjectInit(&local_1c8,db);
      local_1d8 = (undefined1  [16])0x0;
      local_1e8 = (undefined1  [16])0x0;
      local_200._8_16_ = (undefined1  [16])0x0;
      local_1c8.zAuthContext = pTrigger->zName;
      local_1c8.eTriggerOp = pTrigger->op;
      local_1c8.nQueryLoop = pParse->nQueryLoop;
      local_1c8.disableVtab = pParse->disableVtab;
      local_200._0_8_ = &local_1c8;
      local_1c8.pToplevel = pPVar5;
      local_1c8.pTriggerTab = pTab;
      pVVar8 = sqlite3GetVdbe(&local_1c8);
      if (pVVar8 == (Vdbe *)0x0) {
        transferParseError(pParse,&local_1c8);
      }
      else {
        if (pTrigger->zName != (char *)0x0) {
          pcVar9 = sqlite3MPrintf(db,"-- TRIGGER %s");
          sqlite3VdbeChangeP4(pVVar8,-1,pcVar9,-6);
        }
        if (pTrigger->pWhen == (Expr *)0x0) {
          local_260 = 0;
        }
        else {
          pEVar10 = sqlite3ExprDup(db,pTrigger->pWhen,0);
          local_260 = 0;
          if ((db->mallocFailed == '\0') &&
             (iVar4 = sqlite3ResolveExprNames((NameContext *)local_200,pEVar10), local_260 = 0,
             iVar4 == 0)) {
            local_260 = local_1c8.nLabel + -1;
            local_1c8.nLabel = local_260;
            sqlite3ExprIfFalse(&local_1c8,pEVar10,local_260,0x10);
          }
          sqlite3ExprDelete(db,pEVar10);
        }
        ppTVar14 = &pTrigger->step_list;
        p = local_1c8.pVdbe;
        while (pStep = *ppTVar14, pStep != (TriggerStep *)0x0) {
          pEVar12 = (ExprList *)(ulong)(uint)orconf;
          local_1c8.eOrconf = (u8)orconf;
          if (orconf == 0xb) {
            local_1c8.eOrconf = pStep->orconf;
          }
          if (pStep->zSpan != (char *)0x0) {
            pcVar9 = sqlite3MPrintf(local_1c8.db,"-- %s");
            in_stack_fffffffffffffd88 = 0xfffffffa;
            pEVar12 = (ExprList *)0x1;
            in_R8 = (Expr *)0x0;
            sqlite3VdbeAddOp4(p,0xb5,0x7fffffff,1,0,pcVar9,-6);
          }
          uVar2 = pStep->op;
          if (uVar2 == '\x7f') {
            pSVar11 = sqlite3TriggerStepSrc(&local_1c8,pStep);
            pSVar13 = sqlite3SelectDup(local_1c8.db,pStep->pSelect,0);
            pColumn = sqlite3IdListDup(local_1c8.db,pStep->pIdList);
            uVar2 = local_1c8.eOrconf;
            pUpsert = sqlite3UpsertDup(local_1c8.db,pStep->pUpsert);
            in_R8 = (Expr *)(ulong)(uint)uVar2;
            sqlite3Insert(&local_1c8,pSVar11,pSVar13,pColumn,(uint)uVar2,pUpsert);
LAB_0017f614:
            sqlite3VdbeAddOp0(p,0x83);
          }
          else {
            if (uVar2 == 0x80) {
              pSVar11 = sqlite3TriggerStepSrc(&local_1c8,pStep);
              pEVar10 = sqlite3ExprDup(local_1c8.db,pStep->pWhere,0);
              sqlite3DeleteFrom(&local_1c8,pSVar11,pEVar10,pEVar12,in_R8);
              goto LAB_0017f614;
            }
            if (uVar2 == 0x81) {
              pSVar11 = sqlite3TriggerStepSrc(&local_1c8,pStep);
              pEVar12 = sqlite3ExprListDup(local_1c8.db,pStep->pExprList,0);
              pEVar10 = sqlite3ExprDup(local_1c8.db,pStep->pWhere,0);
              in_R8 = (Expr *)(ulong)local_1c8.eOrconf;
              sqlite3Update(&local_1c8,pSVar11,pEVar12,pEVar10,(uint)local_1c8.eOrconf,
                            (ExprList *)0x0,
                            (Expr *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                            (Upsert *)p);
              goto LAB_0017f614;
            }
            pSVar13 = sqlite3SelectDup(local_1c8.db,pStep->pSelect,0);
            local_228[0] = '\x04';
            local_210 = (char *)0x0;
            local_228._4_16_ = (undefined1  [16])0x0;
            sqlite3Select(&local_1c8,pSVar13,(SelectDest *)local_228);
            sqlite3SelectDelete(local_1c8.db,pSVar13);
          }
          ppTVar14 = &pStep->pNext;
        }
        if (local_260 != 0) {
          sqlite3VdbeResolveLabel(pVVar8,local_260);
        }
        sqlite3VdbeAddOp0(pVVar8,0x46);
        transferParseError(pParse,&local_1c8);
        if (pParse->nErr == 0) {
          pOVar3 = pVVar8->aOp;
          resolveP2Values(pVVar8,&pPVar5->nMaxArg);
          pSVar7->nOp = pVVar8->nOp;
          pVVar8->aOp = (Op *)0x0;
          pSVar7->aOp = pOVar3;
        }
        pSVar7->nMem = local_1c8.nMem;
        pSVar7->nCsr = local_1c8.nTab;
        pSVar7->token = pTrigger;
        pTVar6->aColmask[0] = local_1c8.oldmask;
        pTVar6->aColmask[1] = local_1c8.newmask;
        sqlite3VdbeDelete(pVVar8);
      }
      sqlite3ParseObjectReset(&local_1c8);
      goto LAB_0017f72c;
    }
  }
  pTVar6 = (TriggerPrg *)0x0;
LAB_0017f72c:
  pParse->db->errByteOffset = -1;
  return pTVar6;
}

Assistant:

static TriggerPrg *getRowTrigger(
  Parse *pParse,       /* Current parse context */
  Trigger *pTrigger,   /* Trigger to code */
  Table *pTab,         /* The table trigger pTrigger is attached to */
  int orconf           /* ON CONFLICT algorithm. */
){
  Parse *pRoot = sqlite3ParseToplevel(pParse);
  TriggerPrg *pPrg;

  assert( pTrigger->zName==0 || pTab==tableOfTrigger(pTrigger) );

  /* It may be that this trigger has already been coded (or is in the
  ** process of being coded). If this is the case, then an entry with
  ** a matching TriggerPrg.pTrigger field will be present somewhere
  ** in the Parse.pTriggerPrg list. Search for such an entry.  */
  for(pPrg=pRoot->pTriggerPrg;
      pPrg && (pPrg->pTrigger!=pTrigger || pPrg->orconf!=orconf);
      pPrg=pPrg->pNext
  );

  /* If an existing TriggerPrg could not be located, create a new one. */
  if( !pPrg ){
    pPrg = codeRowTrigger(pParse, pTrigger, pTab, orconf);
    pParse->db->errByteOffset = -1;
  }

  return pPrg;
}